

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O2

void expr_dsp(t_expr *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  t_float *ptVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  char *fmt;
  ulong uVar8;
  size_t __nmemb;
  
  x->exp_error = 0;
  iVar1 = x->exp_vsize;
  iVar2 = (*sp)->s_n;
  x->exp_vsize = iVar2;
  uVar5 = 0;
  uVar8 = (ulong)(uint)x->exp_nexpr;
  if (x->exp_nexpr < 1) {
    uVar8 = uVar5;
  }
  plVar6 = &x->exp_res[0].ex_type;
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    *plVar6 = 0xf;
    ((ex_ex *)(plVar6 + -1))->ex_cont =
         (anon_union_8_5_735de1bb_for_ex_cont)sp[(long)x->exp_nivec + uVar5]->s_vec;
    plVar6 = plVar6 + 3;
  }
  plVar6 = &x->exp_var[0].ex_type;
  lVar7 = 0;
  uVar3 = 0;
  do {
    if (lVar7 == 0) {
LAB_00196301:
      if (x->exp_nivec <= (int)uVar3) {
        fmt = "expr_dsp int. err nv = %d, x->exp_nive = %d";
LAB_00196435:
        post(fmt,(ulong)uVar3);
        abort();
      }
      ((ex_ex *)(plVar6 + -1))->ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)sp[(int)uVar3]->s_vec
      ;
      uVar3 = uVar3 + 1;
    }
    else {
      if (lVar7 == 100) {
        if ((uVar3 == x->exp_nivec) || ((uVar3 == 0 && (x->exp_nivec == 1)))) {
          uVar8 = 0;
          dsp_add(expr_perform,1,x);
          if (x->exp_p_res[0] == (t_float *)0x0) goto LAB_001963bf;
          if (iVar1 != iVar2) {
            for (lVar7 = 0; lVar7 < x->exp_nexpr; lVar7 = lVar7 + 1) {
              free(x->exp_p_res[lVar7]);
              free(x->exp_tmpres[lVar7]);
            }
            for (lVar7 = 0; lVar7 != 100; lVar7 = lVar7 + 1) {
              free(x->exp_p_var[lVar7]);
            }
LAB_001963bf:
            uVar5 = (ulong)(uint)x->exp_nexpr;
            if (x->exp_nexpr < 1) {
              uVar5 = uVar8;
            }
            __nmemb = (size_t)x->exp_vsize;
            for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
              ptVar4 = (t_float *)calloc(__nmemb,4);
              x->exp_p_res[uVar8] = ptVar4;
              ptVar4 = (t_float *)calloc(__nmemb,4);
              x->exp_tmpres[uVar8] = ptVar4;
            }
            for (lVar7 = 0; lVar7 != 100; lVar7 = lVar7 + 1) {
              ptVar4 = (t_float *)calloc(__nmemb,4);
              x->exp_p_var[lVar7] = ptVar4;
            }
          }
          return;
        }
        fmt = "expr_dsp internal error 2 nv = %d, x->exp_nive = %d";
        goto LAB_00196435;
      }
      if ((*plVar6 == 0x12) || (*plVar6 == 0xe)) goto LAB_00196301;
    }
    lVar7 = lVar7 + 1;
    plVar6 = plVar6 + 3;
  } while( true );
}

Assistant:

static void
expr_dsp(t_expr *x, t_signal **sp)
{
        int i, nv;
        int newsize;

        x->exp_error = 0;               /* reset all errors */
        newsize = (x->exp_vsize !=  sp[0]->s_n);
        x->exp_vsize = sp[0]->s_n;      /* record the vector size */
        for (i = 0; i < x->exp_nexpr; i++) {
                x->exp_res[i].ex_type = ET_VEC;
                x->exp_res[i].ex_vec =  sp[x->exp_nivec + i]->s_vec;
        }
        for (i = 0, nv = 0; i < MAX_VARS; i++)
                /*
                 * the first inlet is always a signal
                 *
                 * SDY  We are warning the user till this limitation
                 * is taken away from pd
                 */
                if (!i || x->exp_var[i].ex_type == ET_VI ||
                                        x->exp_var[i].ex_type == ET_XI) {
                        if (nv >= x->exp_nivec) {
                          post("expr_dsp int. err nv = %d, x->exp_nive = %d",
                                                          nv,  x->exp_nivec);
                          abort();
                        }
                        x->exp_var[i].ex_vec  = sp[nv]->s_vec;
                        nv++;
                }
        /* we always have one inlet but we may not use it */
        if (nv != x->exp_nivec && (nv != 0 ||  x->exp_nivec != 1)) {
                post("expr_dsp internal error 2 nv = %d, x->exp_nive = %d",
                                                          nv,  x->exp_nivec);
                abort();
        }

        dsp_add(expr_perform, 1, (t_int *) x);

        /*
         * The buffer are now being allocated for expr~ and fexpr~
         * because if we have more than one expression we need the
         * temporary buffers, The save buffers are not really needed
        if (!IS_FEXPR_TILDE(x))
                return;
         */
        /*
         * if we have already allocated the buffers and we have a
         * new size free all the buffers
         */
        if (x->exp_p_res[0]) {
                if (!newsize)
                        return;
                /*
                 * if new size, reallocate all the previous buffers for fexpr~
                 */
                for (i = 0; i < x->exp_nexpr; i++) {
                        fts_free(x->exp_p_res[i]);
                        fts_free(x->exp_tmpres[i]);
                }
                for (i = 0; i < MAX_VARS; i++)
                        fts_free(x->exp_p_var[i]);

        }
        for (i = 0; i < x->exp_nexpr; i++) {
                x->exp_p_res[i] = fts_calloc(x->exp_vsize, sizeof (t_float));
                x->exp_tmpres[i] = fts_calloc(x->exp_vsize, sizeof (t_float));
        }
        for (i = 0; i < MAX_VARS; i++)
                x->exp_p_var[i] = fts_calloc(x->exp_vsize, sizeof (t_float));
}